

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListDoubleAddPairFirst(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  int *piVar1;
  Fxu_Pair *pFVar2;
  
  pFVar2 = (pDiv->lPairs).pHead;
  if (pFVar2 == (Fxu_Pair *)0x0) {
    (pDiv->lPairs).pHead = pLink;
    (pDiv->lPairs).pTail = pLink;
    pLink->pDPrev = (Fxu_Pair *)0x0;
    pLink->pDNext = (Fxu_Pair *)0x0;
  }
  else {
    pLink->pDPrev = (Fxu_Pair *)0x0;
    pFVar2->pDPrev = pLink;
    pLink->pDNext = pFVar2;
    (pDiv->lPairs).pHead = pLink;
  }
  piVar1 = &(pDiv->lPairs).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListDoubleAddPairFirst( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
    Fxu_ListPair * pList = &pDiv->lPairs;
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pDPrev = NULL;
        pLink->pDNext = NULL;
    }
    else
    {
        pLink->pDPrev = NULL;
        pList->pHead->pDPrev = pLink;
        pLink->pDNext = pList->pHead;
        pList->pHead = pLink;
    }
    pList->nItems++;
}